

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::CapturePageHeapFreeStack(LargeHeapBlock *this)

{
  code *pcVar1;
  bool bVar2;
  StackBackTrace *pSVar3;
  undefined8 *in_FS_OFFSET;
  LargeHeapBlock *this_local;
  
  bVar2 = InPageHeapMode(this);
  if (bVar2) {
    if (this->pageHeapData->pageHeapFreeStack != (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x993,"(this->pageHeapData->pageHeapFreeStack == nullptr)",
                         "this->pageHeapData->pageHeapFreeStack == nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if (this->pageHeapData->pageHeapAllocStack == (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x994,"(this->pageHeapData->pageHeapAllocStack != nullptr)",
                         "this->pageHeapData->pageHeapAllocStack != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if (this->pageHeapData->pageHeapFreeStack == (StackBackTrace *)0x0) {
      pSVar3 = StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
                         ((NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,0,0x20);
      this->pageHeapData->pageHeapFreeStack = pSVar3;
    }
    else {
      StackBackTrace::Capture(this->pageHeapData->pageHeapFreeStack,0);
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::CapturePageHeapFreeStack()
{
#ifdef STACK_BACK_TRACE
    if (this->InPageHeapMode()) // pageheap can be enabled only for some of the buckets
    {
        // These asserts are true because explicit free is disallowed in
        // page heap mode. If they weren't, we'd have to modify the asserts
        Assert(this->pageHeapData->pageHeapFreeStack == nullptr);
        Assert(this->pageHeapData->pageHeapAllocStack != nullptr);

        if (this->pageHeapData->pageHeapFreeStack != nullptr)
        {
            this->pageHeapData->pageHeapFreeStack->Capture(Recycler::s_numFramesToSkipForPageHeapFree);
        }
        else
        {
            this->pageHeapData->pageHeapFreeStack = StackBackTrace::Capture(&NoThrowHeapAllocator::Instance,
                Recycler::s_numFramesToSkipForPageHeapFree, Recycler::s_numFramesToCaptureForPageHeap);
        }
    }
#endif
}